

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

OnCallSpec<int_(int)> * __thiscall
testing::internal::FunctionMocker<int_(int)>::AddNewOnCallSpec
          (FunctionMocker<int_(int)> *this,char *file,int line,ArgumentMatcherTuple *m)

{
  void *mock_obj;
  OnCallSpec<int_(int)> *this_00;
  OnCallSpec<int_(int)> *local_48 [3];
  OnCallSpec<int_(int)> *local_30;
  OnCallSpec<int_(int)> *on_call_spec;
  ArgumentMatcherTuple *m_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  FunctionMocker<int_(int)> *this_local;
  
  on_call_spec = (OnCallSpec<int_(int)> *)m;
  m_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,pcStack_18,m_local._4_4_);
  this_00 = (OnCallSpec<int_(int)> *)operator_new(0x60);
  OnCallSpec<int_(int)>::OnCallSpec
            (this_00,pcStack_18,m_local._4_4_,(ArgumentMatcherTuple *)on_call_spec);
  local_48[0] = this_00;
  local_30 = this_00;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::push_back
            (&(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_,local_48);
  return local_30;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    OnCallSpec<F>* const on_call_spec = new OnCallSpec<F>(file, line, m);
    untyped_on_call_specs_.push_back(on_call_spec);
    return *on_call_spec;
  }